

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O2

void __thiscall App::drawScores(App *this,Graphics *g)

{
  int iVar1;
  ostream *this_00;
  string sStack_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream ss;
  undefined1 local_198 [376];
  
  piksel::Graphics::push(g);
  piksel::Sprite::draw
            ((this->spritesheet).sprites.
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start + 0x27,g,0.0,0.0,32.0,32.0,false,false,false);
  piksel::Sprite::draw
            ((this->spritesheet).sprites.
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start + 0x28,g,(float)((this->super_BaseApp).width + -0x50),
             0.0,32.0,32.0,false,false,false);
  piksel::Graphics::textSize(g,16.0);
  iVar1 = Character::getLives(&this->character);
  std::__cxx11::to_string((string *)&ss,iVar1);
  std::operator+(&local_1c8,"x0",(string *)&ss);
  piksel::Graphics::text(g,&local_1c8,32.0,24.0);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&ss);
  iVar1 = Ball::getLives(&this->ball);
  std::__cxx11::to_string((string *)&ss,iVar1);
  std::operator+(&local_1e8,"x0",(string *)&ss);
  piksel::Graphics::text(g,&local_1e8,(float)((this->super_BaseApp).width + -0x2f),24.0);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  this_00 = std::operator<<(local_198,0x30);
  *(undefined8 *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x10) = 6;
  iVar1 = Ball::getScore(&this->ball);
  std::ostream::operator<<(this_00,iVar1);
  std::__cxx11::stringbuf::str();
  piksel::Graphics::text(g,&sStack_208,(float)((this->super_BaseApp).width / 2 + -0x27),24.0);
  std::__cxx11::string::~string((string *)&sStack_208);
  piksel::Graphics::pop(g);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void App::drawScores(piksel::Graphics& g) {
    g.push();
    spritesheet.sprites[39].draw(g, 0, 0, 32, 32);
    spritesheet.sprites[40].draw(g, width - 80, 0, 32, 32);
    g.textSize(16);
    g.text("x0" + std::to_string(character.getLives()), 32, 24);
    g.text("x0" + std::to_string(ball.getLives()), width - 47, 24);
    std::stringstream ss;
    ss << std::setfill('0') << std::setw(6) << ball.getScore();
    g.text(ss.str(), width / 2 - 39, 24);
    g.pop();
}